

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_material.cpp
# Opt level: O2

int IntersectBoxRayHelper(ON_3dPoint *rst,ON_3dVector *n,int dir,double *s)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  double dVar4;
  double dVar5;
  uint uVar6;
  ON_3dPoint *pOVar7;
  double *pdVar8;
  undefined4 uVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  ON_3dPoint local_a8;
  undefined1 local_88 [16];
  undefined8 local_78;
  undefined8 uStack_70;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  uVar9 = SUB84(s,0);
  local_88._0_8_ = (&n->x)[(uint)dir];
  dVar12 = -1.0 - (&rst->x)[(uint)dir];
  iVar10 = 0;
  if ((ABS((double)local_88._0_8_) * 1e+100 <= ABS(dVar12)) ||
     (local_78 = 1.0 - (&rst->x)[(uint)dir], ABS((double)local_88._0_8_) * 1e+100 <= ABS(local_78)))
  {
    local_78._0_4_ = 0x9e331dd2;
    local_78._4_4_ = 0xffe5f8bd;
  }
  else {
    uStack_70 = 0;
    local_88._8_8_ = 0;
    dVar12 = dVar12 / (double)local_88._0_8_;
    operator*(&local_60,dVar12,n);
    pOVar7 = ON_3dPoint::operator+(&local_a8,rst,&local_60);
    dVar4 = local_a8.x;
    if (dir != 0) {
      pdVar8 = ON_3dPoint::operator[](&local_a8,dir);
      local_a8.x = *pdVar8;
      pOVar7 = (ON_3dPoint *)ON_3dPoint::operator[](&local_a8,dir);
      pOVar7->x = dVar4;
    }
    dVar5 = local_a8.x;
    auVar1._8_4_ = (int)-(ulong)(1.0000000149011612 < ABS(local_a8.z));
    auVar1._0_8_ = -(ulong)(1.0000000149011612 < ABS(local_a8.y));
    auVar1._12_4_ = (int)(-(ulong)(1.0000000149011612 < ABS(local_a8.z)) >> 0x20);
    uVar6 = movmskpd((int)pOVar7,auVar1);
    dVar4 = -1.23432101234321e+308;
    if ((uVar6 & 2) == 0) {
      dVar4 = dVar12;
    }
    dVar12 = -1.23432101234321e+308;
    if ((uVar6 & 1) == 0) {
      dVar12 = dVar4;
    }
    local_78 = local_78 / (double)local_88._0_8_;
    operator*(&local_48,local_78,n);
    ON_3dPoint::operator+((ON_3dPoint *)&local_60,rst,&local_48);
    uVar11 = -(ulong)(1.490116119385e-08 < ABS(dVar5 + 1.0));
    local_88._0_8_ = ~uVar11 & (ulong)dVar12;
    local_88._8_8_ = 0;
    local_a8.z = local_60.z;
    local_a8.x = local_60.x;
    local_a8.y = local_60.y;
    if (dir != 0) {
      pdVar8 = ON_3dPoint::operator[](&local_a8,dir);
      local_a8.x = *pdVar8;
      pdVar8 = ON_3dPoint::operator[](&local_a8,dir);
      *pdVar8 = local_60.x;
    }
    auVar3._8_8_ = 0;
    auVar3._0_8_ = uVar11 & 0xffe5f8bd9e331dd2;
    local_88 = local_88 | auVar3;
    auVar2._8_4_ = (int)-(ulong)(1.0000000149011612 < ABS(local_a8.z));
    auVar2._0_8_ = -(ulong)(1.0000000149011612 < ABS(local_a8.y));
    auVar2._12_4_ = (int)(-(ulong)(1.0000000149011612 < ABS(local_a8.z)) >> 0x20);
    uVar9 = movmskpd(uVar9,auVar2);
    dVar12 = local_88._0_8_;
    if ((((byte)uVar9 >> 1 | (byte)uVar9) & 1) != 0 || 1.490116119385e-08 < ABS(local_a8.x + -1.0))
    {
      local_78._0_4_ = 0x9e331dd2;
      local_78._4_4_ = 0xffe5f8bd;
      if ((dVar12 == -1.23432101234321e+308) && (iVar10 = 0, !NAN(dVar12))) goto LAB_004f2fae;
    }
    if (((dVar12 == -1.23432101234321e+308) && (!NAN(dVar12))) ||
       ((dVar12 < 0.0 && dVar12 < (double)CONCAT44(local_78._4_4_,(undefined4)local_78) ||
        (0.0 <= (double)CONCAT44(local_78._4_4_,(undefined4)local_78) &&
         (double)CONCAT44(local_78._4_4_,(undefined4)local_78) < dVar12)))) {
      iVar10 = dir * 2 + 2;
    }
    else {
      iVar10 = dir * 2 + 1;
      local_78._0_4_ = local_88._0_4_;
      local_78._4_4_ = local_88._4_4_;
    }
  }
LAB_004f2fae:
  *s = (double)CONCAT44(local_78._4_4_,(undefined4)local_78);
  return iVar10;
}

Assistant:

static
int IntersectBoxRayHelper(const ON_3dPoint& rst, const ON_3dVector& n, int dir, double* s)
{
  /*
  returns:
    0 = ray parallel to sides
    1 = ray hit left side (x=-1)
    2 = ray hit right side (x=+1)
    3 = ray hit back side (y=-1)
    4 = ray hit front side (y=+1)
    5 = ray hit bottom side (z=-1)
    6 = ray hit top side (z=+1)
  */
  double nx = (&n.x)[dir];
  ON_3dPoint Q;
  double t,t0,t1;

  // protect against overflow
  t = fabs(nx)*on__overflow_tol;
  t0 = (-1.0 - (&rst.x)[dir]);
  t1 = ( 1.0 - (&rst.x)[dir]);
  if ( fabs(t0) >= t || fabs(t1) >= t )
  {
    *s = ON_UNSET_VALUE;
    return 0;
  }

  t0 /= nx;
  Q = rst + t0*n;
  if ( dir )
  {
    t = Q.x;
    Q.x = Q[dir];
    Q[dir] = t;
  }
  if ( fabs(Q.x+1.0) > ON_SQRT_EPSILON
        || Q.y < -(1.0+ON_SQRT_EPSILON) || Q.y > (1.0+ON_SQRT_EPSILON)
        || Q.z < -(1.0+ON_SQRT_EPSILON) || Q.z > (1.0+ON_SQRT_EPSILON)
        )
  {
    // The ray's intersection with the plane missed the
    // (-1,+1)x(-1,+1) square that is the side of the box.
    t0 = ON_UNSET_VALUE;
  }

  t1 /= nx;
  Q = rst + t1*n;
  if ( dir )
  {
    t = Q.x;
    Q.x = Q[dir];
    Q[dir] = t;
  }
  if ( fabs(Q.x-1.0) > ON_SQRT_EPSILON
        || Q.y < -(1.0+ON_SQRT_EPSILON) || Q.y > (1.0+ON_SQRT_EPSILON)
        || Q.z < -(1.0+ON_SQRT_EPSILON) || Q.z > (1.0+ON_SQRT_EPSILON)
        )
  {
    // The ray's intersection with the plane missed the
    // (-1,+1)x(-1,+1) square that is the side of the box.
    t1 = ON_UNSET_VALUE;
    if ( ON_UNSET_VALUE == t0 )
    {
      *s = ON_UNSET_VALUE;
      return 0;
    }
  }

  int rc;
  if ( ON_UNSET_VALUE == t0 || 1 == BestHitHelper(t0,t1) )
  {
    rc = 2 + 2*dir;
    *s = t1;
  }
  else
  {
    rc = 1 + 2*dir;
    *s = t0;
  }
  return rc;
}